

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFPageObjectHelper::forEachXObject
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action,function<bool_(QPDFObjectHandle)> *selector)

{
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  _List_node_base *p_Var1;
  bool bVar2;
  __index_type _Var3;
  QPDFObjGen og;
  QPDF_Dictionary *pQVar4;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar5;
  _Node *p_Var6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  undefined7 in_register_00000031;
  QPDFObjectHandle obj;
  list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> queue;
  QPDFObjectHandle xobj_dict;
  set seen;
  element_type *local_e8;
  _Base_ptr local_e0;
  undefined1 local_d8 [16];
  _List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_c8;
  BaseHandle local_b0;
  undefined1 local_a0 [16];
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  undefined1 local_70 [8];
  _Rb_tree_node_base local_68;
  size_t local_48;
  element_type *local_38;
  
  if ((int)CONCAT71(in_register_00000031,recursive) == 0) {
    local_70 = (undefined1  [8])
               (this->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count + 1;
      }
    }
    QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_70);
  }
  else {
    local_70 = (undefined1  [8])
               (this->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_)->_M_use_count + 1;
      }
    }
    QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_70);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_);
  }
  local_68._M_left = (_Base_ptr)(local_70 + 8);
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  local_68._M_parent = (_Base_ptr)0x0;
  local_48 = 0;
  local_c8._M_impl._M_node._M_size = 0;
  local_c8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c8;
  local_c8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c8;
  local_68._M_right = local_68._M_left;
  std::__cxx11::list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
  _M_insert<QPDFPageObjectHelper&>
            ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)&local_c8,
             (iterator)&local_c8,this);
  if (local_c8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_c8) {
    do {
      p_Var1 = local_c8._M_impl._M_node.super__List_node_base._M_next;
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                     ((BaseHandle *)
                      &local_c8._M_impl._M_node.super__List_node_base._M_next[1]._M_prev);
      bVar2 = QPDFObjGen::set::add((set *)local_70,og);
      if (bVar2) {
        local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/Resources","");
        getAttribute((QPDFPageObjectHelper *)&stack0xffffffffffffffc0,(string *)(p_Var1 + 1),
                     SUB81((string *)&local_b0,0));
        local_e8 = (element_type *)local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"/XObject","");
        QPDFObjectHandle::getKeyIfDict
                  ((QPDFObjectHandle *)(local_a0 + 0x10),(string *)&stack0xffffffffffffffc0);
        if (local_e8 != (element_type *)local_d8) {
          operator_delete(local_e8,local_d8._0_8_ + 1);
        }
        if (local_38 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
        if (local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_a0) {
          operator_delete(local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_a0._0_8_ + 1);
        }
        local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_90.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_90.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_90.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_90.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_90.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_90.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        pQVar4 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_b0);
        if (pQVar4 == (QPDF_Dictionary *)0x0) {
          p_Var7 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var7 = (pQVar4->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        pQVar4 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_b0);
        p_Var8 = &(pQVar4->items)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (pQVar4 == (QPDF_Dictionary *)0x0) {
          p_Var8 = (_Rb_tree_node_base *)0x0;
        }
        for (; p_Var7 != p_Var8; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  **)(p_Var7 + 2);
          if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      *)0x0) {
            _Var3 = (__v->
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ).
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    ._M_index;
            if (_Var3 == '\x0f') {
              pvVar5 = std::
                       get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                 (__v);
LAB_001d4914:
              _Var3 = *(__index_type *)
                       ((long)&(((pvVar5->obj).
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->value).
                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                               .
                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       + 0x30);
            }
            else if (_Var3 == '\r') {
              pvVar5 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                        *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                        *(QPDFObjGen *)
                                         ((long)&__v[1].
                                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 .
                                                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                 ._M_u + 0x18));
              goto LAB_001d4914;
            }
            if (_Var3 != '\x02') {
              local_e8 = *(element_type **)(p_Var7 + 2);
              local_e0 = p_Var7[2]._M_parent;
              if (local_e0 != (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&local_e0->_M_parent = *(int *)&local_e0->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&local_e0->_M_parent = *(int *)&local_e0->_M_parent + 1;
                }
              }
              if ((selector->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001d49b6:
                if ((action->super__Function_base)._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                (*action->_M_invoker)
                          ((_Any_data *)action,(QPDFObjectHandle *)&local_e8,
                           (QPDFObjectHandle *)(local_a0 + 0x10),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var7 + 1));
              }
              else {
                local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_e8;
                local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0;
                if (local_e0 != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&local_e0->_M_parent = *(int *)&local_e0->_M_parent + 1;
                    UNLOCK();
                    if ((selector->super__Function_base)._M_manager == (_Manager_type)0x0) {
                      std::__throw_bad_function_call();
                    }
                  }
                  else {
                    *(int *)&local_e0->_M_parent = *(int *)&local_e0->_M_parent + 1;
                  }
                }
                bVar2 = (*selector->_M_invoker)((_Any_data *)selector,&local_80);
                if ((_Base_ptr)
                    local_80.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Base_ptr)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_80.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                if (bVar2) goto LAB_001d49b6;
              }
              if ((recursive) &&
                 (bVar2 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_e8), bVar2)) {
                p_Var6 = std::__cxx11::
                         list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
                         _M_create_node<QPDFObjectHandle&>
                                   ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>
                                     *)&local_c8,(QPDFObjectHandle *)&local_e8);
                std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
                local_c8._M_impl._M_node._M_size = local_c8._M_impl._M_node._M_size + 1;
              }
              if (local_e0 != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0);
              }
            }
          }
        }
        if (local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      p_Var1 = local_c8._M_impl._M_node.super__List_node_base._M_next;
      local_c8._M_impl._M_node._M_size = local_c8._M_impl._M_node._M_size - 1;
      std::__detail::_List_node_base::_M_unhook();
      (*(code *)(p_Var1[1]._M_next)->_M_next)(p_Var1 + 1);
      operator_delete(p_Var1,0x48);
    } while (local_c8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_c8)
    ;
  }
  std::__cxx11::_List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::_M_clear
            (&local_c8);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
               *)local_70);
  return;
}

Assistant:

void
QPDFPageObjectHelper::forEachXObject(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action,
    std::function<bool(QPDFObjectHandle)> selector)
{
    QTC::TC(
        "qpdf",
        "QPDFPageObjectHelper::forEachXObject",
        recursive ? (oh().isFormXObject() ? 0 : 1) : (oh().isFormXObject() ? 2 : 3));
    QPDFObjGen::set seen;
    std::list<QPDFPageObjectHelper> queue;
    queue.emplace_back(*this);
    while (!queue.empty()) {
        auto& ph = queue.front();
        if (seen.add(ph)) {
            auto xobj_dict = ph.getAttribute("/Resources", false).getKeyIfDict("/XObject");
            for (auto const& [key, value]: xobj_dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }
                auto obj = value;
                if ((!selector) || selector(obj)) {
                    action(obj, xobj_dict, key);
                }
                if (recursive && obj.isFormXObject()) {
                    queue.emplace_back(obj);
                }
            }
        }
        queue.pop_front();
    }
}